

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O3

Node * __thiscall Parser::parseUnaryOp(Parser *this)

{
  uint uVar1;
  Token *t;
  int iVar2;
  TokenType TVar3;
  pointer pTVar4;
  Node *pNVar5;
  
  iVar2 = this->pos;
  pTVar4 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  TVar3 = pTVar4[iVar2].type;
  uVar1 = TVar3 - TK_NOT;
  if (((0x3c < uVar1) || ((0x1200400000000183U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     (1 < TVar3 - TK_PLUS)) {
    pNVar5 = parseReaderMacro(this);
    return pNVar5;
  }
  t = pTVar4 + iVar2;
  this->tok = t;
  this->pos = iVar2 + 1;
  pNVar5 = parseUnaryOp(this);
  pNVar5 = createUnaryPreOpNode(this,t,pNVar5);
  return pNVar5;
}

Assistant:

Node * parseUnaryOp()
  {
    if (accept(TK_MINUS) || accept(TK_PLUS) || accept(TK_INV) || accept(TK_NOT) || accept(TK_PLUSPLUS) || accept(TK_MINUSMINUS) ||
      accept(TK_TYPEOF) || accept(TK_DELETE) || accept(TK_CLONE))
    {
      Token & opToken = *tok;
      return createUnaryPreOpNode(opToken, parseUnaryOp());
    }
    else
    {
      return parseReaderMacro();
    }
  }